

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

ZipFile * __thiscall Assimp::ZipFileInfo::Extract(ZipFileInfo *this,unzFile zip_handle)

{
  int iVar1;
  pointer puVar2;
  unz_file_pos_s *num_bytes;
  ZipFile *local_30;
  ZipFile *zip_file;
  unz_file_pos_s *filepos;
  unzFile zip_handle_local;
  ZipFileInfo *this_local;
  
  num_bytes = &this->m_ZipFilePos;
  iVar1 = unzGoToFilePos(zip_handle);
  if (iVar1 == 0) {
    iVar1 = unzOpenCurrentFile(zip_handle);
    if (iVar1 == 0) {
      local_30 = (ZipFile *)
                 Intern::AllocateFromAssimpHeap::operator_new
                           ((AllocateFromAssimpHeap *)0x20,(size_t)num_bytes);
      ZipFile::ZipFile(local_30,this->m_Size);
      puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         (&local_30->m_Buffer);
      iVar1 = unzReadCurrentFile(zip_handle,puVar2,this->m_Size & 0xffffffff);
      if (iVar1 != (int)this->m_Size) {
        if (local_30 != (ZipFile *)0x0) {
          (*(local_30->super_IOStream)._vptr_IOStream[1])();
        }
        local_30 = (ZipFile *)0x0;
      }
      iVar1 = unzCloseCurrentFile(zip_handle);
      if (iVar1 != 0) {
        __assert_fail("unzCloseCurrentFile(zip_handle) == (0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/ZipArchiveIOSystem.cpp"
                      ,0xef,"ZipFile *Assimp::ZipFileInfo::Extract(unzFile) const");
      }
      this_local = (ZipFileInfo *)local_30;
    }
    else {
      this_local = (ZipFileInfo *)0x0;
    }
  }
  else {
    this_local = (ZipFileInfo *)0x0;
  }
  return (ZipFile *)this_local;
}

Assistant:

ZipFile * ZipFileInfo::Extract(unzFile zip_handle) const {
        // Find in the ZIP. This cannot fail
        unz_file_pos_s *filepos = const_cast<unz_file_pos_s*>(&(m_ZipFilePos));
        if (unzGoToFilePos(zip_handle, filepos) != UNZ_OK)
            return nullptr;

        if (unzOpenCurrentFile(zip_handle) != UNZ_OK)
            return nullptr;

        ZipFile *zip_file = new ZipFile(m_Size);

        if (unzReadCurrentFile(zip_handle, zip_file->m_Buffer.get(), static_cast<unsigned int>(m_Size)) != static_cast<int>(m_Size))
        {
            // Failed, release the memory
            delete zip_file;
            zip_file = nullptr;
        }

        ai_assert(unzCloseCurrentFile(zip_handle) == UNZ_OK);
        return zip_file;
    }